

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rand_lib.c
# Opt level: O0

int RAND_set_DRBG_type(OSSL_LIB_CTX *ctx,char *drbg,char *propq,char *cipher,char *digest)

{
  int iVar1;
  RAND_GLOBAL *p;
  char *in_R8;
  RAND_GLOBAL *dgbl;
  uint7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  bool bVar2;
  uint local_4;
  
  p = rand_get_global((OSSL_LIB_CTX *)0x2b54b7);
  if (p == (RAND_GLOBAL *)0x0) {
    local_4 = 0;
  }
  else if (p->primary == (EVP_RAND_CTX *)0x0) {
    iVar1 = random_set_string((char **)p,
                              (char *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0))
    ;
    bVar2 = false;
    if (iVar1 != 0) {
      iVar1 = random_set_string((char **)p,(char *)(ulong)in_stack_ffffffffffffffc0);
      bVar2 = false;
      if (iVar1 != 0) {
        iVar1 = random_set_string((char **)p,(char *)(ulong)in_stack_ffffffffffffffc0);
        bVar2 = false;
        if (iVar1 != 0) {
          iVar1 = random_set_string((char **)p,(char *)(ulong)in_stack_ffffffffffffffc0);
          bVar2 = iVar1 != 0;
        }
      }
    }
    local_4 = (uint)bVar2;
  }
  else {
    ERR_new();
    ERR_set_debug(in_R8,(int)((ulong)p >> 0x20),
                  (char *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
    ERR_set_error(0xf,0x67,(char *)0x0);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int RAND_set_DRBG_type(OSSL_LIB_CTX *ctx, const char *drbg, const char *propq,
                       const char *cipher, const char *digest)
{
    RAND_GLOBAL *dgbl = rand_get_global(ctx);

    if (dgbl == NULL)
        return 0;
    if (dgbl->primary != NULL) {
        ERR_raise(ERR_LIB_CRYPTO, RAND_R_ALREADY_INSTANTIATED);
        return 0;
    }
    return random_set_string(&dgbl->rng_name, drbg)
        && random_set_string(&dgbl->rng_propq, propq)
        && random_set_string(&dgbl->rng_cipher, cipher)
        && random_set_string(&dgbl->rng_digest, digest);
}